

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

bool __thiscall HighsSparseMatrix::debugPartitionOk(HighsSparseMatrix *this,int8_t *in_partition)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0;
  uVar6 = (ulong)(uint)this->num_row_;
  if (this->num_row_ < 1) {
    uVar6 = uVar7;
  }
  bVar5 = true;
  do {
    if (uVar7 == uVar6) {
      return bVar5;
    }
    iVar1 = piVar3[uVar7];
    iVar2 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7];
    if (iVar1 < iVar2) {
      lVar8 = 0;
      do {
        if (in_partition[piVar4[iVar1 + lVar8]] == '\0') {
          bVar5 = false;
          break;
        }
        lVar8 = lVar8 + 1;
      } while (iVar2 - iVar1 != (int)lVar8);
    }
    if (!bVar5) {
      return bVar5;
    }
    iVar1 = piVar3[uVar7 + 1];
    if (iVar2 < iVar1) {
      lVar8 = 0;
      do {
        if (in_partition[piVar4[iVar2 + lVar8]] != '\0') {
          bVar5 = false;
          break;
        }
        lVar8 = lVar8 + 1;
      } while (iVar1 - iVar2 != (int)lVar8);
    }
    uVar7 = uVar7 + 1;
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool HighsSparseMatrix::debugPartitionOk(const int8_t* in_partition) const {
  assert(this->format_ == MatrixFormat::kRowwisePartitioned);
  bool ok = true;
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    for (HighsInt iEl = this->start_[iRow]; iEl < this->p_end_[iRow]; iEl++) {
      if (!in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
    for (HighsInt iEl = this->p_end_[iRow]; iEl < this->start_[iRow + 1];
         iEl++) {
      if (in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
  }
  return ok;
}